

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void av1_crc32c_calculator_init(CRC32C *p_crc32c)

{
  int n;
  long lVar1;
  uint32_t *puVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar4 = 0;
  uVar5 = 1;
  uVar6 = 2;
  uVar7 = 3;
  lVar1 = 0;
  do {
    uVar9 = (int)(uVar5 << 0x1f) >> 0x1f;
    uVar13 = (int)(uVar7 << 0x1f) >> 0x1f;
    uVar9 = (uVar5 >> 1 ^ 0x82f63b78) & uVar9 | ~uVar9 & uVar5 >> 1;
    uVar8 = (uVar7 >> 1 ^ 0x82f63b78) & uVar13 | ~uVar13 & uVar7 >> 1;
    uVar10 = uVar9 >> 1;
    uVar14 = uVar8 >> 1;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar13 = (int)((uVar6 >> 1) << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar11 = (uVar10 ^ 0x82f63b78) & uVar9 | ~uVar9 & uVar10;
    uVar12 = (uVar6 >> 2 ^ 0x82f63b78) & uVar13 | ~uVar13 & uVar6 >> 2;
    uVar14 = (uVar14 ^ 0x82f63b78) & uVar8 | ~uVar8 & uVar14;
    uVar13 = uVar11 >> 1;
    uVar8 = uVar12 >> 1;
    uVar10 = uVar14 >> 1;
    uVar9 = (int)((uVar4 >> 2) << 0x1f) >> 0x1f;
    uVar11 = (int)(uVar11 << 0x1f) >> 0x1f;
    uVar12 = (int)(uVar12 << 0x1f) >> 0x1f;
    uVar14 = (int)(uVar14 << 0x1f) >> 0x1f;
    uVar9 = (uVar4 >> 3 ^ 0x82f63b78) & uVar9 | ~uVar9 & uVar4 >> 3;
    uVar13 = (uVar13 ^ 0x82f63b78) & uVar11 | ~uVar11 & uVar13;
    uVar8 = (uVar8 ^ 0x82f63b78) & uVar12 | ~uVar12 & uVar8;
    uVar10 = (uVar10 ^ 0x82f63b78) & uVar14 | ~uVar14 & uVar10;
    uVar11 = uVar9 >> 1;
    uVar12 = uVar13 >> 1;
    uVar14 = uVar8 >> 1;
    uVar15 = uVar10 >> 1;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar13 = (int)(uVar13 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar9 = (uVar11 ^ 0x82f63b78) & uVar9 | ~uVar9 & uVar11;
    uVar13 = (uVar12 ^ 0x82f63b78) & uVar13 | ~uVar13 & uVar12;
    uVar8 = (uVar14 ^ 0x82f63b78) & uVar8 | ~uVar8 & uVar14;
    uVar10 = (uVar15 ^ 0x82f63b78) & uVar10 | ~uVar10 & uVar15;
    uVar11 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar12 = (int)(uVar13 << 0x1f) >> 0x1f;
    uVar14 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar15 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar9 = uVar9 >> 1;
    uVar13 = uVar13 >> 1;
    uVar8 = uVar8 >> 1;
    uVar10 = uVar10 >> 1;
    uVar9 = (uVar9 ^ 0x82f63b78) & uVar11 | ~uVar11 & uVar9;
    uVar13 = (uVar13 ^ 0x82f63b78) & uVar12 | ~uVar12 & uVar13;
    uVar8 = (uVar8 ^ 0x82f63b78) & uVar14 | ~uVar14 & uVar8;
    uVar10 = (uVar10 ^ 0x82f63b78) & uVar15 | ~uVar15 & uVar10;
    uVar11 = uVar9 >> 1;
    uVar12 = uVar13 >> 1;
    uVar14 = uVar8 >> 1;
    uVar15 = uVar10 >> 1;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar13 = (int)(uVar13 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
    uVar11 = (uVar11 ^ 0x82f63b78) & uVar9 | ~uVar9 & uVar11;
    uVar12 = (uVar12 ^ 0x82f63b78) & uVar13 | ~uVar13 & uVar12;
    uVar14 = (uVar14 ^ 0x82f63b78) & uVar8 | ~uVar8 & uVar14;
    uVar15 = (uVar15 ^ 0x82f63b78) & uVar10 | ~uVar10 & uVar15;
    uVar9 = uVar11 >> 1;
    uVar13 = uVar12 >> 1;
    uVar8 = uVar14 >> 1;
    uVar10 = uVar15 >> 1;
    uVar11 = (int)(uVar11 << 0x1f) >> 0x1f;
    uVar12 = (int)(uVar12 << 0x1f) >> 0x1f;
    uVar14 = (int)(uVar14 << 0x1f) >> 0x1f;
    uVar15 = (int)(uVar15 << 0x1f) >> 0x1f;
    uVar9 = (uVar9 ^ 0x82f63b78) & uVar11 | ~uVar11 & uVar9;
    uVar13 = (uVar13 ^ 0x82f63b78) & uVar12 | ~uVar12 & uVar13;
    uVar8 = (uVar8 ^ 0x82f63b78) & uVar14 | ~uVar14 & uVar8;
    uVar10 = (uVar10 ^ 0x82f63b78) & uVar15 | ~uVar15 & uVar10;
    uVar11 = uVar9 >> 1;
    uVar12 = uVar13 >> 1;
    uVar14 = uVar8 >> 1;
    uVar15 = uVar10 >> 1;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar13 = (int)(uVar13 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar8 << 0x1f) >> 0x1f;
    uVar10 = (int)(uVar10 << 0x1f) >> 0x1f;
    puVar2 = p_crc32c->table[0] + lVar1;
    *puVar2 = (uVar11 ^ 0x82f63b78) & uVar9 | ~uVar9 & uVar11;
    puVar2[1] = (uVar12 ^ 0x82f63b78) & uVar13 | ~uVar13 & uVar12;
    puVar2[2] = (uVar14 ^ 0x82f63b78) & uVar8 | ~uVar8 & uVar14;
    puVar2[3] = (uVar15 ^ 0x82f63b78) & uVar10 | ~uVar10 & uVar15;
    lVar1 = lVar1 + 4;
    uVar4 = uVar4 + 4;
    uVar5 = uVar5 + 4;
    uVar6 = uVar6 + 4;
    uVar7 = uVar7 + 4;
  } while (lVar1 != 0x100);
  lVar1 = 0;
  puVar2 = (uint32_t *)p_crc32c;
  do {
    uVar4 = p_crc32c->table[0][lVar1];
    lVar3 = 0x400;
    do {
      uVar4 = uVar4 >> 8 ^ p_crc32c->table[0][uVar4 & 0xff];
      *(uint *)((long)puVar2 + lVar3) = uVar4;
      lVar3 = lVar3 + 0x400;
    } while (lVar3 != 0x2000);
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

void av1_crc32c_calculator_init(CRC32C *p_crc32c) {
  uint32_t crc;

  for (int n = 0; n < 256; n++) {
    crc = n;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    crc = crc & 1 ? (crc >> 1) ^ POLY : crc >> 1;
    p_crc32c->table[0][n] = crc;
  }
  for (int n = 0; n < 256; n++) {
    crc = p_crc32c->table[0][n];
    for (int k = 1; k < 8; k++) {
      crc = p_crc32c->table[0][crc & 0xff] ^ (crc >> 8);
      p_crc32c->table[k][n] = crc;
    }
  }
}